

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance_test_framework.cpp
# Opt level: O2

void __thiscall
PerformanceTestFramework::add(PerformanceTestFramework *this,testFunction test,string *name)

{
  undefined1 local_38 [40];
  
  local_38._0_8_ = test;
  std::__cxx11::string::string((string *)(local_38 + 8),(string *)name);
  std::
  _Rb_tree<std::pair<double,double>(*)(),std::pair<std::pair<double,double>(*const)(),std::__cxx11::string>,std::_Select1st<std::pair<std::pair<double,double>(*const)(),std::__cxx11::string>>,std::less<std::pair<double,double>(*)()>,std::allocator<std::pair<std::pair<double,double>(*const)(),std::__cxx11::string>>>
  ::_M_emplace_unique<std::pair<std::pair<double,double>(*)(),std::__cxx11::string>>
            ((_Rb_tree<std::pair<double,double>(*)(),std::pair<std::pair<double,double>(*const)(),std::__cxx11::string>,std::_Select1st<std::pair<std::pair<double,double>(*const)(),std::__cxx11::string>>,std::less<std::pair<double,double>(*)()>,std::allocator<std::pair<std::pair<double,double>(*const)(),std::__cxx11::string>>>
              *)this,(pair<std::pair<double,_double>_(*)(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_38);
  std::__cxx11::string::~string((string *)(local_38 + 8));
  return;
}

Assistant:

void PerformanceTestFramework::add( const testFunction test, const std::string & name )
{
    _performanceTest.insert( std::pair < testFunction, std::string > ( test, name ) );
}